

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tb.cc
# Opt level: O0

void __thiscall
kratos::AssertValueStmt::AssertValueStmt(AssertValueStmt *this,shared_ptr<kratos::Var> *expr)

{
  initializer_list<const_kratos::IRNode_*> __l;
  int iVar1;
  element_type *peVar2;
  VarException *this_00;
  allocator<const_kratos::IRNode_*> local_81;
  element_type *local_80;
  element_type **local_78;
  size_type local_70;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_68;
  allocator<char> local_49;
  string local_48;
  shared_ptr<kratos::Var> *local_18;
  shared_ptr<kratos::Var> *expr_local;
  AssertValueStmt *this_local;
  
  local_18 = expr;
  expr_local = (shared_ptr<kratos::Var> *)this;
  AssertBase::AssertBase(&this->super_AssertBase);
  (this->super_AssertBase).super_Stmt.super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_0058fe98
  ;
  std::shared_ptr<kratos::Var>::shared_ptr(&this->assert_var_,expr);
  std::shared_ptr<kratos::Stmt>::shared_ptr(&this->else_stmt_,(nullptr_t)0x0);
  peVar2 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->assert_var_);
  iVar1 = (*(peVar2->super_IRNode)._vptr_IRNode[7])();
  if (iVar1 != 1) {
    this_00 = (VarException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"Assert variable has to be width 1",&local_49);
    local_80 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                         (&(this->assert_var_).
                           super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>);
    local_78 = &local_80;
    local_70 = 1;
    std::allocator<const_kratos::IRNode_*>::allocator(&local_81);
    __l._M_len = local_70;
    __l._M_array = (iterator)local_78;
    std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
              (&local_68,__l,&local_81);
    VarException::VarException(this_00,&local_48,&local_68);
    __cxa_throw(this_00,&VarException::typeinfo,VarException::~VarException);
  }
  return;
}

Assistant:

AssertValueStmt::AssertValueStmt(std::shared_ptr<Var> expr) : assert_var_(std::move(expr)) {
    // making sure that the expression has to be width 1
    if (assert_var_->width() != 1)
        throw VarException("Assert variable has to be width 1", {assert_var_.get()});
}